

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedInts::_InternalParse
          (TensorValue_RepeatedInts *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint32_t value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  TensorValue_RepeatedInts *local_38;
  
  local_48 = ptr;
  local_38 = this;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
      if (bVar1) {
        return local_48;
      }
      local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
      tag_00 = local_3c;
      if ((local_3c & 0xfffffff8) == 8) break;
LAB_001af6c5:
      if ((local_3c == 0) || ((local_3c & 7) == 4)) {
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        return local_48;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_48 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
LAB_001af6ef:
      if (local_48 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if (local_3c == 10) {
      local_48 = google::protobuf::internal::PackedInt32Parser(&this->values_,local_48,ctx);
      goto LAB_001af6ef;
    }
    if (local_3c != 8) goto LAB_001af6c5;
    value = google::protobuf::internal::ReadVarint32(&local_48);
    _internal_add_values(local_38,value);
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* TensorValue_RepeatedInts::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated int32 values = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_values(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 8) {
          _internal_add_values(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}